

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  undefined4 *puVar2;
  FILE *__stream;
  long *plVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  undefined4 uVar9;
  int *piVar10;
  long lVar11;
  undefined8 uVar12;
  undefined8 extraout_RAX;
  undefined8 in_R9;
  bool bVar13;
  whisper_params params;
  whisper_context_params cparams;
  size_type __dnew;
  allocator<char> local_8ad;
  int local_8ac;
  uint local_8a8;
  int local_8a4;
  long **local_8a0;
  long *local_898;
  long *local_890 [2];
  undefined2 local_880;
  int local_874;
  ushort local_870;
  undefined2 uStack_86e;
  undefined4 uStack_86c;
  undefined4 uStack_868;
  undefined4 local_860;
  undefined4 uStack_85c;
  undefined4 uStack_858;
  undefined4 local_850;
  undefined4 uStack_848;
  char *local_840;
  long *local_838 [2];
  long local_828 [255];
  
  uVar4 = std::thread::hardware_concurrency();
  local_8a8 = 4;
  if ((int)uVar4 < 4) {
    local_8a8 = uVar4;
  }
  local_8a4 = 0;
  local_8a0 = local_890;
  local_838[0] = (long *)0x17;
  local_8a0 = (long **)std::__cxx11::string::_M_create((ulong *)&local_8a0,(ulong)local_838);
  local_890[0] = local_838[0];
  *local_8a0 = (long *)0x672f736c65646f6d;
  local_8a0[1] = (long *)0x657361622d6c6d67;
  builtin_strncpy((char *)((long)local_8a0 + 0xf),"e.en.bin",8);
  local_898 = local_838[0];
  *(char *)((long)local_8a0 + (long)local_838[0]) = '\0';
  local_880 = 1;
  local_874 = argc;
  if (1 < argc) {
    iVar7 = 1;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_838,argv[iVar7],(allocator<char> *)&local_870);
      iVar5 = std::__cxx11::string::compare((char *)local_838);
      if ((iVar5 == 0) || (iVar5 = std::__cxx11::string::compare((char *)local_838), iVar5 == 0)) {
        main_cold_11();
LAB_00102d4a:
        std::__throw_invalid_argument("stoi");
LAB_00102d56:
        std::__throw_out_of_range("stoi");
LAB_00102d62:
        main_cold_1();
        if (local_8a0 != local_890) {
          operator_delete(local_8a0,(long)local_890[0] + 1);
        }
        _Unwind_Resume(extraout_RAX);
      }
      iVar5 = std::__cxx11::string::compare((char *)local_838);
      if ((iVar5 == 0) || (iVar5 = std::__cxx11::string::compare((char *)local_838), iVar5 == 0)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_870,argv[(long)iVar7 + 1],&local_8ad);
        pcVar1 = (char *)CONCAT44(uStack_86c,CONCAT22(uStack_86e,local_870));
        piVar10 = __errno_location();
        local_8ac = *piVar10;
        *piVar10 = 0;
        lVar11 = strtol(pcVar1,&local_840,10);
        if (local_840 == pcVar1) goto LAB_00102d4a;
        uVar4 = (uint)lVar11;
        if (((int)uVar4 == lVar11) && (*piVar10 != 0x22)) {
          if (*piVar10 == 0) {
            *piVar10 = local_8ac;
          }
          puVar2 = (undefined4 *)CONCAT44(uStack_86c,CONCAT22(uStack_86e,local_870));
          local_8a8 = uVar4;
          if (puVar2 != &local_860) {
            operator_delete(puVar2,CONCAT44(uStack_85c,local_860) + 1);
          }
          iVar5 = iVar7 + 1;
          goto LAB_00102972;
        }
        goto LAB_00102d56;
      }
      iVar5 = std::__cxx11::string::compare((char *)local_838);
      if ((iVar5 == 0) || (iVar5 = std::__cxx11::string::compare((char *)local_838), iVar5 == 0)) {
        plVar3 = local_898;
        pcVar1 = argv[(long)iVar7 + 1];
        strlen(pcVar1);
        std::__cxx11::string::_M_replace((ulong)&local_8a0,0,(char *)plVar3,(ulong)pcVar1);
        iVar5 = iVar7 + 1;
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)local_838);
        if ((iVar5 == 0) || (iVar5 = std::__cxx11::string::compare((char *)local_838), iVar5 == 0))
        {
          iVar5 = iVar7 + 1;
          local_8a4 = atoi(argv[(long)iVar7 + 1]);
        }
        else {
          iVar6 = std::__cxx11::string::compare((char *)local_838);
          iVar5 = iVar7;
          if ((iVar6 == 0) || (iVar7 = std::__cxx11::string::compare((char *)local_838), iVar7 == 0)
             ) {
            local_880 = local_880 & 0xff00;
          }
          else {
            iVar7 = std::__cxx11::string::compare((char *)local_838);
            if ((iVar7 != 0) &&
               (iVar7 = std::__cxx11::string::compare((char *)local_838), iVar7 != 0))
            goto LAB_00102d62;
            local_880 = CONCAT11(1,(undefined1)local_880);
          }
        }
      }
LAB_00102972:
      if (local_838[0] != local_828) {
        operator_delete(local_838[0],local_828[0] + 1);
      }
      iVar7 = iVar5 + 1;
    } while (iVar7 < local_874);
  }
  if (local_8a4 == 1) {
    iVar7 = whisper_bench_memcpy(local_8a8);
  }
  else if (local_8a4 == 2) {
    iVar7 = whisper_bench_ggml_mul_mat(local_8a8);
  }
  else if (local_8a4 == 0) {
    whisper_context_default_params(&local_870);
    local_870 = local_880;
    uVar9 = CONCAT22(uStack_86e,local_880);
    lVar11 = whisper_init_from_file_with_params(local_8a0);
    fputc(10,_stderr);
    uVar4 = local_8a8;
    __stream = _stderr;
    uVar8 = std::thread::hardware_concurrency();
    uVar12 = whisper_print_system_info();
    fprintf(__stream,"system_info: n_threads = %d / %d | %s\n",(ulong)uVar4,(ulong)uVar8,uVar12,
            in_R9,uVar9,uStack_868,local_860,uStack_858,local_850,uStack_848);
    if (lVar11 == 0) {
      main_cold_10();
      iVar7 = 2;
    }
    else {
      uVar9 = whisper_model_n_mels(lVar11);
      uVar4 = whisper_set_mel(lVar11,0,0,uVar9);
      if (uVar4 == 0) {
        iVar5 = whisper_encode(lVar11,0,local_8a8);
        iVar7 = 3;
        if (iVar5 == 0) {
          memset(local_838,0,0x800);
          iVar5 = whisper_decode(lVar11,local_838,0x100,0,local_8a8);
          if (iVar5 == 0) {
            iVar5 = whisper_decode(lVar11,local_838,1,0x100,local_8a8);
            if (iVar5 == 0) {
              whisper_reset_timings(lVar11);
              iVar5 = whisper_encode(lVar11,0,local_8a8);
              if (iVar5 == 0) {
                bVar13 = false;
                uVar4 = 0;
                do {
                  iVar5 = whisper_decode(lVar11,local_838,1,uVar4,local_8a8);
                  if (iVar5 != 0) {
                    main_cold_6();
                    iVar7 = 4;
                    break;
                  }
                  bVar13 = 0xfe < uVar4;
                  uVar4 = uVar4 + 1;
                } while (uVar4 != 0x100);
                if (bVar13) {
                  bVar13 = false;
                  uVar4 = 0;
                  do {
                    iVar5 = whisper_decode(lVar11,local_838,5,0,local_8a8);
                    if (iVar5 != 0) {
                      main_cold_7();
                      iVar7 = 4;
                      break;
                    }
                    bVar13 = 0x3e < uVar4;
                    uVar4 = uVar4 + 1;
                  } while (uVar4 != 0x40);
                  if (bVar13) {
                    bVar13 = false;
                    uVar4 = 0;
                    do {
                      iVar5 = whisper_decode(lVar11,local_838,0x100,0,local_8a8);
                      if (iVar5 != 0) {
                        main_cold_8();
                        iVar7 = 4;
                        break;
                      }
                      bVar13 = 0xe < uVar4;
                      uVar4 = uVar4 + 1;
                    } while (uVar4 != 0x10);
                    if (bVar13) {
                      whisper_print_timings(lVar11);
                      whisper_free(lVar11);
                      main_cold_9();
                      iVar7 = 0;
                    }
                  }
                }
              }
              else {
                main_cold_5();
                iVar7 = 4;
              }
            }
            else {
              main_cold_4();
              iVar7 = 4;
            }
          }
          else {
            main_cold_3();
            iVar7 = 4;
          }
        }
        else {
          main_cold_2();
          iVar7 = 4;
        }
      }
      else {
        fprintf(_stderr,"error: failed to set mel: %d\n",(ulong)uVar4);
        iVar7 = 3;
      }
    }
  }
  else {
    fprintf(_stderr,"error: unknown benchmark: %d\n");
    iVar7 = -1;
  }
  if (local_8a0 != local_890) {
    operator_delete(local_8a0,(long)local_890[0] + 1);
  }
  return iVar7;
}

Assistant:

int main(int argc, char ** argv) {
    whisper_params params;

    if (whisper_params_parse(argc, argv, params) == false) {
        return 1;
    }

    int ret = -1;

    switch (params.what) {
        case 0: ret = whisper_bench_full(params);                break;
        case 1: ret = whisper_bench_memcpy(params.n_threads);       break;
        case 2: ret = whisper_bench_ggml_mul_mat(params.n_threads); break;
        default: fprintf(stderr, "error: unknown benchmark: %d\n", params.what); break;
    }

    return ret;
}